

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O1

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForEntryId
          (VectorD<long,_3> *__return_storage_ptr__,
          MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          *this,int entry_id)

{
  PointAttribute *this_00;
  AttributeValueIndex att_id;
  
  att_id.value_ = this->entry_to_point_id_map_[entry_id].value_;
  (__return_storage_ptr__->v_)._M_elems[0] = 0;
  (__return_storage_ptr__->v_)._M_elems[1] = 0;
  (__return_storage_ptr__->v_)._M_elems[2] = 0;
  this_00 = this->pos_attribute_;
  if (this_00->identity_mapping_ == false) {
    att_id.value_ =
         *(uint *)((long)(this_00->indices_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (ulong)att_id.value_ * 4);
  }
  GeometryAttribute::ConvertValue<long>
            (&this_00->super_GeometryAttribute,att_id,
             (this_00->super_GeometryAttribute).num_components_,(long *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

VectorD<int64_t, 3> GetPositionForEntryId(int entry_id) const {
    const PointIndex point_id = entry_to_point_id_map_[entry_id];
    VectorD<int64_t, 3> pos;
    pos_attribute_->ConvertValue(pos_attribute_->mapped_index(point_id),
                                 &pos[0]);
    return pos;
  }